

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::GTestLog::GTestLog(GTestLog *this,GTestLogSeverity severity,char *file,int line)

{
  ostream *poVar1;
  char *pcVar2;
  GTestLogSeverity in_ESI;
  GTestLog *in_RDI;
  int in_stack_00000024;
  char *in_stack_00000028;
  char *marker;
  char *local_78;
  char *local_70;
  char *local_68;
  string local_48 [32];
  char *local_28;
  
  in_RDI->severity_ = in_ESI;
  if (in_ESI == GTEST_INFO) {
    local_68 = "[  INFO ]";
  }
  else {
    if (in_ESI == GTEST_WARNING) {
      local_70 = "[WARNING]";
    }
    else {
      if (in_ESI == GTEST_ERROR) {
        local_78 = "[ ERROR ]";
      }
      else {
        local_78 = "[ FATAL ]";
      }
      local_70 = local_78;
    }
    local_68 = local_70;
  }
  local_28 = local_68;
  poVar1 = GetStream(in_RDI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1," ");
  FormatFileLocation_abi_cxx11_(in_stack_00000028,in_stack_00000024);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

GTestLog::GTestLog(GTestLogSeverity severity, const char* file, int line)
    : severity_(severity) {
  const char* const marker =
      severity == GTEST_INFO ?    "[  INFO ]" :
      severity == GTEST_WARNING ? "[WARNING]" :
      severity == GTEST_ERROR ?   "[ ERROR ]" : "[ FATAL ]";
  GetStream() << ::std::endl << marker << " "
              << FormatFileLocation(file, line).c_str() << ": ";
}